

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O3

char * basicgetobjname(Proto *p,int *ppc,int reg,char **name)

{
  Instruction *pIVar1;
  long lVar2;
  int iVar3;
  char *pcVar4;
  TValue *pTVar5;
  uint uVar6;
  char *pcVar7;
  int pc;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  
  pc = *ppc;
  do {
    pcVar4 = luaF_getlocalname(p,reg + 1,pc);
    *name = pcVar4;
    if (pcVar4 != (char *)0x0) {
      return "local";
    }
    pIVar1 = p->code;
    uVar6 = ((char)"\b\n\n\t\t\b\b\b\b\b"[pIVar1[pc] & 0x7f] >> 7) + pc;
    if (uVar6 == 0 ||
        SCARRY4((int)((char)"\b\n\n\t\t\b\b\b\b\b"[pIVar1[pc] & 0x7f] >> 7),pc) != (int)uVar6 < 0) {
      *ppc = -1;
      return (char *)0x0;
    }
    uVar9 = 0;
    pc = -1;
    iVar10 = 0;
    do {
      uVar8 = pIVar1[uVar9];
      uVar13 = uVar8 & 0x7f;
      uVar11 = uVar8 >> 7 & 0xff;
      if (uVar13 < 0x44) {
        if (uVar13 == 8) {
          if (((int)uVar11 <= reg) && ((uint)reg <= uVar11 + (uVar8 >> 0x10 & 0xff)))
          goto LAB_0014005e;
        }
        else {
          if (uVar13 != 0x38) goto LAB_0014004f;
          iVar12 = (int)uVar9 + (uVar8 >> 7) + -0xfffffe;
          iVar3 = iVar10;
          if (iVar10 < iVar12) {
            iVar3 = iVar12;
          }
          if (iVar12 <= (int)uVar6) {
            iVar10 = iVar3;
          }
        }
      }
      else {
        if (1 < uVar13 - 0x44) {
          if (uVar13 != 0x4c) {
LAB_0014004f:
            if ((uVar11 == reg) && (("\b\n\n\t\t\b\b\b\b\b"[uVar13] & 8) != 0)) goto LAB_0014005e;
            goto LAB_00140069;
          }
          uVar11 = uVar11 + 2;
        }
        if ((int)uVar11 <= reg) {
LAB_0014005e:
          pc = (int)uVar9;
          if ((long)uVar9 < (long)iVar10) {
            pc = -1;
          }
        }
      }
LAB_00140069:
      uVar9 = uVar9 + 1;
    } while (uVar6 != uVar9);
    *ppc = pc;
    if (pc == -1) {
      return (char *)0x0;
    }
    uVar6 = pIVar1[pc];
    uVar8 = uVar6 & 0x7f;
    if (uVar8 != 0) {
      if (uVar8 == 3) {
        pTVar5 = p->k;
        uVar6 = uVar6 >> 0xb;
      }
      else {
        if (uVar8 != 4) {
          if (uVar8 != 9) {
            return (char *)0x0;
          }
          lVar2 = *(long *)((long)&p->upvalues->name + (ulong)(uVar6 >> 0xc & 0xff0));
          pcVar4 = "?";
          if (lVar2 != 0) {
            pcVar4 = (char *)(lVar2 + 0x18);
          }
          *name = pcVar4;
          return "upvalue";
        }
        pTVar5 = p->k;
        uVar6 = pIVar1[(long)pc + 1] >> 3;
      }
      if (((&pTVar5->tt_)[uVar6 & 0xfffffff0] & 0xf) == 4) {
        pcVar7 = (char *)(*(long *)((long)&pTVar5->value_ + (ulong)(uVar6 & 0xfffffff0)) + 0x18);
        pcVar4 = "constant";
      }
      else {
        pcVar7 = "?";
        pcVar4 = (char *)0x0;
      }
      *name = pcVar7;
      return pcVar4;
    }
    reg = uVar6 >> 0x10 & 0xff;
    if ((uVar6 >> 7 & 0xff) <= (uint)reg) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

static const char *basicgetobjname (const Proto *p, int *ppc, int reg,
                                    const char **name) {
  int pc = *ppc;
  *name = luaF_getlocalname(p, reg + 1, pc);
  if (*name)  /* is a local? */
    return "local";
  /* else try symbolic execution */
  *ppc = pc = findsetreg(p, pc, reg);
  if (pc != -1) {  /* could find instruction? */
    Instruction i = p->code[pc];
    OpCode op = GET_OPCODE(i);
    switch (op) {
      case OP_MOVE: {
        int b = GETARG_B(i);  /* move from 'b' to 'a' */
        if (b < GETARG_A(i))
          return basicgetobjname(p, ppc, b, name);  /* get name for 'b' */
        break;
      }
      case OP_GETUPVAL: {
        *name = upvalname(p, GETARG_B(i));
        return "upvalue";
      }
      case OP_LOADK: return kname(p, GETARG_Bx(i), name);
      case OP_LOADKX: return kname(p, GETARG_Ax(p->code[pc + 1]), name);
      default: break;
    }
  }
  return NULL;  /* could not find reasonable name */
}